

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O2

double __thiscall
QuasispeciesEdgeCalculator::computeOverlap
          (QuasispeciesEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,double cutoff)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_EAX;
  uint uVar10;
  undefined4 extraout_EAX_00;
  long lVar11;
  AlignmentRecord *pAVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar28 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar17;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  double local_98;
  string local_70;
  string local_50;
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar21 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  
  AlignmentRecord::getName_abi_cxx11_(&local_70,ap1);
  lVar11 = std::__cxx11::string::find((char *)&local_70,0x1ae81e);
  if (lVar11 == -1) {
    lVar11 = 0x10;
  }
  else {
    AlignmentRecord::getName_abi_cxx11_(&local_50,ap2);
    lVar11 = std::__cxx11::string::find((char *)&local_50,0x1ae81e);
    std::__cxx11::string::~string((string *)&local_50);
    lVar11 = (ulong)(lVar11 == -1) * 8 + 8;
  }
  std::__cxx11::string::~string((string *)&local_70);
  auVar30._8_8_ = extraout_XMM1_Qb;
  auVar30._0_8_ = extraout_XMM1_Qa;
  auVar28 = auVar30._4_12_;
  dVar1 = *(double *)((long)&(this->super_EdgeCalculator)._vptr_EdgeCalculator + lVar11);
  bVar4 = AlignmentRecord::isSingleEnd(ap1);
  if ((bVar4) && (bVar4 = AlignmentRecord::isSingleEnd(ap2), bVar4)) {
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart1(ap1);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    uVar8 = AlignmentRecord::getStart1(ap2);
    uVar10 = uVar7 - uVar8;
    if (uVar5 - uVar6 <= uVar7 - uVar8) {
      uVar10 = uVar5 - uVar6;
    }
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap2);
    uVar7 = AlignmentRecord::getStart1(ap1);
    pAVar12 = ap2;
    uVar8 = AlignmentRecord::getStart1(ap2);
    fVar15 = overlapSize((QuasispeciesEdgeCalculator *)pAVar12,uVar5,uVar6,uVar7,uVar8);
    if (dVar1 <= 1.0) {
      fVar15 = fVar15 / (float)(int)uVar10;
    }
    if ((double)fVar15 < dVar1) {
      return 0.0;
    }
    dVar1 = singleOverlap(this,ap1,ap2,1,1,dVar1,cutoff);
    return dVar1;
  }
  bVar4 = AlignmentRecord::isSingleEnd(ap1);
  if ((bVar4) || (bVar4 = AlignmentRecord::isSingleEnd(ap2), bVar4)) {
    bVar4 = AlignmentRecord::isSingleEnd(ap1);
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart1(ap1);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    uVar8 = AlignmentRecord::getStart1(ap2);
    uVar10 = uVar7 - uVar8;
    if (uVar5 - uVar6 <= uVar7 - uVar8) {
      uVar10 = uVar5 - uVar6;
    }
    if (bVar4) {
      uVar6 = AlignmentRecord::getEnd1(ap1);
      uVar7 = AlignmentRecord::getStart1(ap1);
      uVar8 = AlignmentRecord::getEnd2(ap2);
      uVar9 = AlignmentRecord::getStart2(ap2);
      uVar5 = uVar8 - uVar9;
      if (uVar6 - uVar7 <= uVar8 - uVar9) {
        uVar5 = uVar6 - uVar7;
      }
      uVar6 = AlignmentRecord::getEnd1(ap1);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      uVar8 = AlignmentRecord::getStart1(ap1);
      pAVar12 = ap2;
      uVar9 = AlignmentRecord::getStart1(ap2);
      fVar15 = overlapSize((QuasispeciesEdgeCalculator *)pAVar12,uVar6,uVar7,uVar8,uVar9);
      uVar6 = AlignmentRecord::getEnd1(ap1);
      uVar7 = AlignmentRecord::getEnd2(ap2);
      uVar8 = AlignmentRecord::getStart1(ap1);
      pAVar12 = ap2;
      uVar9 = AlignmentRecord::getStart2(ap2);
      fVar16 = overlapSize((QuasispeciesEdgeCalculator *)pAVar12,uVar6,uVar7,uVar8,uVar9);
      auVar18._0_4_ = (float)(int)uVar5;
      auVar18._4_12_ = auVar28;
      auVar20._12_4_ = auVar28._8_4_;
      auVar20._0_8_ = auVar18._0_8_;
      auVar20._8_4_ = auVar28._0_4_;
      auVar19._8_8_ = auVar20._8_8_;
      auVar19._4_4_ = (float)(int)uVar10;
      auVar19._0_4_ = auVar18._0_4_;
      auVar21._0_12_ = auVar19._0_12_;
      auVar21._12_4_ = extraout_XMM0_Db;
      auVar29._4_4_ = fVar15;
      auVar29._0_4_ = fVar16;
      auVar29._12_4_ = extraout_XMM0_Db_00;
      auVar29._8_4_ = extraout_XMM0_Db_01;
      auVar30 = divps(auVar29,auVar21);
      uVar17 = CONCAT44((int)((uint)(1.0 < dVar1) << 0x1f) >> 0x1f,
                        (int)((uint)(1.0 < dVar1) << 0x1f) >> 0x1f);
      auVar22._0_8_ = ~uVar17 & auVar30._0_8_;
      auVar22._8_8_ = auVar30._8_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = CONCAT44(fVar15,fVar16) & uVar17;
      fVar15 = SUB164(auVar22 | auVar2,0);
      fVar16 = SUB164(auVar22 | auVar2,4);
      if (((double)fVar16 < dVar1) || ((double)fVar15 < dVar1)) {
        iVar13 = -(uint)(0.0 < fVar15);
        iVar14 = -(uint)(0.0 < fVar16);
        auVar32._4_4_ = iVar14;
        auVar32._0_4_ = iVar13;
        auVar32._8_4_ = iVar14;
        auVar32._12_4_ = iVar14;
        auVar31._8_8_ = auVar32._8_8_;
        auVar31._4_4_ = iVar13;
        auVar31._0_4_ = iVar13;
        uVar10 = movmskpd(extraout_EAX,auVar31);
        if ((uVar10 & 1) == 0) {
          return 0.0;
        }
        if ((byte)((byte)uVar10 >> 1) == 0) {
          return 0.0;
        }
        if ((double)(fVar16 + fVar15) < dVar1) {
          return 0.0;
        }
      }
      iVar14 = 1;
      local_98 = singleOverlap(this,ap1,ap2,1,1,dVar1,cutoff);
      iVar13 = 2;
    }
    else {
      uVar6 = AlignmentRecord::getEnd2(ap1);
      uVar7 = AlignmentRecord::getStart2(ap1);
      uVar8 = AlignmentRecord::getEnd1(ap2);
      uVar9 = AlignmentRecord::getStart1(ap2);
      uVar5 = uVar8 - uVar9;
      if (uVar6 - uVar7 <= uVar8 - uVar9) {
        uVar5 = uVar6 - uVar7;
      }
      uVar6 = AlignmentRecord::getEnd1(ap1);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      uVar8 = AlignmentRecord::getStart1(ap1);
      pAVar12 = ap2;
      uVar9 = AlignmentRecord::getStart1(ap2);
      fVar15 = overlapSize((QuasispeciesEdgeCalculator *)pAVar12,uVar6,uVar7,uVar8,uVar9);
      uVar6 = AlignmentRecord::getEnd2(ap1);
      uVar7 = AlignmentRecord::getEnd1(ap2);
      uVar8 = AlignmentRecord::getStart2(ap1);
      pAVar12 = ap2;
      uVar9 = AlignmentRecord::getStart1(ap2);
      fVar16 = overlapSize((QuasispeciesEdgeCalculator *)pAVar12,uVar6,uVar7,uVar8,uVar9);
      auVar23._0_4_ = (float)(int)uVar5;
      auVar23._4_12_ = auVar28;
      auVar25._12_4_ = auVar28._8_4_;
      auVar25._0_8_ = auVar23._0_8_;
      auVar25._8_4_ = auVar28._0_4_;
      auVar24._8_8_ = auVar25._8_8_;
      auVar24._4_4_ = (float)(int)uVar10;
      auVar24._0_4_ = auVar23._0_4_;
      auVar26._0_12_ = auVar24._0_12_;
      auVar26._12_4_ = extraout_XMM0_Db;
      auVar33._4_4_ = fVar15;
      auVar33._0_4_ = fVar16;
      auVar33._12_4_ = extraout_XMM0_Db_02;
      auVar33._8_4_ = extraout_XMM0_Db_03;
      auVar30 = divps(auVar33,auVar26);
      uVar17 = CONCAT44((int)((uint)(1.0 < dVar1) << 0x1f) >> 0x1f,
                        (int)((uint)(1.0 < dVar1) << 0x1f) >> 0x1f);
      auVar27._0_8_ = ~uVar17 & auVar30._0_8_;
      auVar27._8_8_ = auVar30._8_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = CONCAT44(fVar15,fVar16) & uVar17;
      fVar15 = SUB164(auVar27 | auVar3,0);
      fVar16 = SUB164(auVar27 | auVar3,4);
      if (((double)fVar16 < dVar1) || ((double)fVar15 < dVar1)) {
        iVar13 = -(uint)(0.0 < fVar15);
        iVar14 = -(uint)(0.0 < fVar16);
        auVar35._4_4_ = iVar14;
        auVar35._0_4_ = iVar13;
        auVar35._8_4_ = iVar14;
        auVar35._12_4_ = iVar14;
        auVar34._8_8_ = auVar35._8_8_;
        auVar34._4_4_ = iVar13;
        auVar34._0_4_ = iVar13;
        uVar10 = movmskpd(extraout_EAX_00,auVar34);
        if ((uVar10 & 1) == 0) {
          return 0.0;
        }
        if ((byte)((byte)uVar10 >> 1) == 0) {
          return 0.0;
        }
        if ((double)(fVar16 + fVar15) < dVar1) {
          return 0.0;
        }
      }
      local_98 = singleOverlap(this,ap1,ap2,1,1,dVar1,cutoff);
      iVar14 = 2;
      iVar13 = 1;
    }
  }
  else {
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getStart1(ap1);
    uVar7 = AlignmentRecord::getEnd1(ap2);
    uVar8 = AlignmentRecord::getStart1(ap2);
    uVar10 = uVar7 - uVar8;
    if (uVar5 - uVar6 <= uVar7 - uVar8) {
      uVar10 = uVar5 - uVar6;
    }
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap2);
    uVar7 = AlignmentRecord::getStart1(ap1);
    pAVar12 = ap2;
    uVar8 = AlignmentRecord::getStart1(ap2);
    fVar15 = overlapSize((QuasispeciesEdgeCalculator *)pAVar12,uVar5,uVar6,uVar7,uVar8);
    if (dVar1 <= 1.0) {
      fVar15 = fVar15 / (float)(int)uVar10;
    }
    if ((double)fVar15 < dVar1) {
      return 0.0;
    }
    uVar5 = AlignmentRecord::getEnd2(ap1);
    uVar6 = AlignmentRecord::getStart2(ap1);
    uVar7 = AlignmentRecord::getEnd2(ap2);
    uVar8 = AlignmentRecord::getStart2(ap2);
    uVar10 = uVar7 - uVar8;
    if (uVar5 - uVar6 <= uVar7 - uVar8) {
      uVar10 = uVar5 - uVar6;
    }
    uVar5 = AlignmentRecord::getEnd2(ap1);
    uVar6 = AlignmentRecord::getEnd2(ap2);
    uVar7 = AlignmentRecord::getStart2(ap1);
    pAVar12 = ap2;
    uVar8 = AlignmentRecord::getStart2(ap2);
    fVar15 = overlapSize((QuasispeciesEdgeCalculator *)pAVar12,uVar5,uVar6,uVar7,uVar8);
    if (dVar1 <= 1.0) {
      fVar15 = fVar15 / (float)(int)uVar10;
    }
    if ((double)fVar15 < dVar1) {
      return 0.0;
    }
    local_98 = singleOverlap(this,ap1,ap2,1,1,dVar1,cutoff);
    iVar14 = 2;
    iVar13 = iVar14;
  }
  dVar1 = singleOverlap(this,ap1,ap2,iVar14,iVar13,dVar1,cutoff);
  return dVar1 * local_98;
}

Assistant:

double QuasispeciesEdgeCalculator::computeOverlap(const AlignmentRecord & ap1, const AlignmentRecord & ap2, const double cutoff) const {

    double MIN_OVERLAP = 0;
    if (ap1.getName().find("Clique") != string::npos && ap2.getName().find("Clique") != string::npos) {
        MIN_OVERLAP = MIN_OVERLAP_CLIQUES;
    } else {
        MIN_OVERLAP = MIN_OVERLAP_SINGLE;
    }

    if (ap1.isSingleEnd() && ap2.isSingleEnd()) {
        int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
        float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
        if (MIN_OVERLAP <= 1) overlap_size1 /= (float) read_size1;
        if (overlap_size1 < MIN_OVERLAP) return 0;
        return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff);
    } else if (ap1.isSingleEnd() || ap2.isSingleEnd()) {
        if (ap1.isSingleEnd()) {
            int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
            int read_size2 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd2() - ap2.getStart2());
            float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
            float overlap_size2 = overlapSize(ap1.getEnd1(), ap2.getEnd2(), ap1.getStart1(), ap2.getStart2());
            if (MIN_OVERLAP <= 1) {
                overlap_size1 /= (float) read_size1;
                overlap_size2 /= (float) read_size2;
            }
            if ((overlap_size1 >= MIN_OVERLAP && overlap_size2 >= MIN_OVERLAP) || (overlap_size1+overlap_size2 >= MIN_OVERLAP && overlap_size1 > 0 && overlap_size2 > 0)) {
                return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff)*singleOverlap(ap1, ap2, 1, 2, MIN_OVERLAP, cutoff);
            }
            return 0;
        } else {
            int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
            int read_size2 = min(ap1.getEnd2() - ap1.getStart2(), ap2.getEnd1() - ap2.getStart1());

            float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
            float overlap_size2 = overlapSize(ap1.getEnd2(), ap2.getEnd1(), ap1.getStart2(), ap2.getStart1());
            if (MIN_OVERLAP <= 1) {
                overlap_size1 /= (float) read_size1;
                overlap_size2 /= (float) read_size2;
            }
            if ((overlap_size1 >= MIN_OVERLAP && overlap_size2 >= MIN_OVERLAP) || (overlap_size1+overlap_size2 >= MIN_OVERLAP && overlap_size1 > 0 && overlap_size2 > 0)) {
                return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff)*singleOverlap(ap1, ap2, 2, 1, MIN_OVERLAP, cutoff);
            }
            return 0;
        }
    } else {
        int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
        float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
        if (MIN_OVERLAP <= 1) overlap_size1 /= (float) read_size1;
        if (overlap_size1 < MIN_OVERLAP) return 0;

        int read_size2 = min(ap1.getEnd2() - ap1.getStart2(), ap2.getEnd2() - ap2.getStart2());
        float overlap_size2 = overlapSize(ap1.getEnd2(), ap2.getEnd2(), ap1.getStart2(), ap2.getStart2());
        if (MIN_OVERLAP <= 1) overlap_size2 /= (float) read_size2;
        if (overlap_size2 < MIN_OVERLAP) return 0;

        return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff)*singleOverlap(ap1, ap2, 2, 2, MIN_OVERLAP, cutoff);
    }

    return 0;
}